

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acceleration_stabilization.cpp
# Opt level: O3

int test(void)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *pdVar9;
  ActualDstType actualDst;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *pdVar10;
  ulong uVar11;
  byte bVar12;
  Vector x0;
  Vector uk;
  IndexedMatrixArray u;
  DynamicalSystemSimulator sim;
  IMUFixedContactDynamicalSystem imu;
  void *local_3d8;
  long local_3d0;
  void *local_3c8 [2];
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  uint local_3a0 [2];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_398 [16];
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_350;
  void *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined4 local_2f0 [2];
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  DynamicalSystemSimulator local_298 [240];
  IMUFixedContactDynamicalSystem local_1a8 [376];
  
  bVar12 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_2f0);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_3a0);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  IMUFixedContactDynamicalSystem(local_1a8,0.005);
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator(local_298);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor
            ((DynamicalSystemFunctorBase *)local_298);
  local_348 = (void *)0x12;
  uStack_338 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_3d8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_348);
  lVar6 = 0;
  do {
    iVar2 = rand();
    if (local_3d0 <= lVar6) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    dVar1 = (double)iVar2 / 2147483647.0 + -0.5;
    *(double *)((long)local_3d8 + lVar6 * 8) = dVar1 + dVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x12);
  stateObservation::DynamicalSystemSimulator::setState((Matrix *)local_298,(uint)&local_3d8);
  uVar3 = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::getInputSize();
  local_348 = (void *)(ulong)uVar3;
  uStack_338 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_3c8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_348);
  uVar11 = 0;
  do {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_348,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3c8);
    lVar6 = (local_368 - local_360 >> 3) * -0x5555555555555555 +
            ((local_350 - local_370 >> 3) + -1 + (ulong)(local_350 == 0)) * 0x15;
    lVar5 = local_378 - local_388 >> 3;
    lVar7 = lVar5 * -0x5555555555555555 + lVar6;
    if (lVar7 == 0) {
LAB_001045b9:
      if (lVar6 == lVar5 * 0x5555555555555555) {
        local_3a0[0] = (uint)uVar11;
      }
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back(local_398,(value_type *)&local_348);
    }
    else {
      uVar8 = lVar7 + (ulong)local_3a0[0];
      if ((uVar11 < local_3a0[0]) || (uVar8 <= uVar11)) {
        if (uVar11 != uVar8) {
          __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                        ,0xaa,
                        "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const")
          ;
        }
        goto LAB_001045b9;
      }
      uVar8 = (ulong)((uint)uVar11 - local_3a0[0]);
      uVar4 = (local_388 - local_380 >> 3) * -0x5555555555555555 + uVar8;
      if ((long)uVar4 < 0) {
        uVar8 = ~(~uVar4 / 0x15);
LAB_0010461e:
        lVar6 = uVar8 * -0x1f8 + *(long *)(local_370 + uVar8 * 8);
        uVar8 = uVar4;
      }
      else {
        lVar6 = local_388;
        if (0x14 < uVar4) {
          uVar8 = uVar4 / 0x15;
          goto LAB_0010461e;
        }
      }
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)(lVar6 + uVar8 * 0x18),
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_348,
                 (assign_op<double,_double> *)&local_3b8);
    }
    free(local_348);
    stateObservation::DynamicalSystemSimulator::setInput
              ((Matrix *)local_298,
               (uint)(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3c8);
    uVar11 = uVar11 + 1;
    if (uVar11 == 2000) {
      stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setSamplingPeriod
                (0.005);
      stateObservation::DynamicalSystemSimulator::simulateDynamicsTo((uint)local_298);
      stateObservation::DynamicalSystemSimulator::getStateArray((uint)&local_348,(uint)local_298);
      local_2f0[0] = local_348._0_4_;
      local_3b8 = local_2e8;
      uStack_3b0 = uStack_2e0;
      pdVar9 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_340;
      pdVar10 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_2e8;
      for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined8 *)pdVar10 = *(undefined8 *)pdVar9;
        pdVar9 = pdVar9 + (ulong)bVar12 * -0x10 + 8;
        pdVar10 = pdVar10 + (ulong)bVar12 * -0x10 + 8;
      }
      local_340 = local_2e8;
      uStack_338 = uStack_2e0;
      local_330 = local_2d8;
      uStack_328 = uStack_2d0;
      local_320 = local_2c8;
      uStack_318 = uStack_2c0;
      local_310 = local_2b8;
      uStack_308 = uStack_2b0;
      local_300 = local_2a8;
      uStack_2f8 = uStack_2a0;
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::clear((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&local_340);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_340);
      stateObservation::IndexedMatrixArray::writeInFile((char *)local_2f0);
      free(local_3c8[0]);
      free(local_3d8);
      stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator(local_298);
      stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
      ~IMUFixedContactDynamicalSystem(local_1a8);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque(local_398);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_2e8);
      return 0;
    }
  } while( true );
}

Assistant:

int test()
{
    /// The number of samples
    const unsigned kmax=2000;

    ///sampling period
    const double dt=5e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=15;
    (void)measurementSize;
    (void)inputSize;


    for (unsigned i = 0; i<1; ++i)
    {
    	///The array containing all the states, the measurements and the inputs
    	IndexedMatrixArray x;
    	IndexedMatrixArray u;

        ///simulation of the signal
        /// the IMU dynamical system functor
        flexibilityEstimation::IMUFixedContactDynamicalSystem imu(dt);

        ///the simulator initalization
        DynamicalSystemSimulator sim;
        sim.setDynamicsFunctor( & imu); // choice of the dynamical system

        Vector x0=(Vector::Zero(stateSize,1));

        ///initialization of the state vector
        for (unsigned j= 0; j<stateSize ;++j)
        	x0[j]=(double(rand())/RAND_MAX -0.5)*2;

        sim.setState(x0,0);

        Vector uk=Vector::Zero(imu.getInputSize(),1);


        for (unsigned k=0;k<kmax;++k)
        {
        	u.setValue(uk,k);

            ///give the input to the simulator
            ///we only need to give one value and the
            ///simulator takes automatically the appropriate value
            sim.setInput(uk,k);
        }

        ///set the sampling perdiod to the functor
        imu.setSamplingPeriod(dt);

        sim.simulateDynamicsTo(kmax);

        x = sim.getStateArray(1,kmax);

        x.writeInFile("state.dat");
        //std::cout <<x[kmax].norm ()<< " "<< x[kmax].transpose() << std::endl;
    }

    return 0;

}